

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

void av1_count_colors(uint8_t *src,int stride,int rows,int cols,int *val_count,int *num_colors)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  memset(val_count,0,0x400);
  if (0 < rows) {
    uVar3 = 0;
    do {
      if (0 < cols) {
        uVar4 = 0;
        do {
          val_count[src[uVar4]] = val_count[src[uVar4]] + 1;
          uVar4 = uVar4 + 1;
        } while ((uint)cols != uVar4);
      }
      uVar3 = uVar3 + 1;
      src = src + stride;
    } while (uVar3 != (uint)rows);
  }
  lVar2 = 0;
  iVar5 = 0;
  iVar6 = 0;
  iVar7 = 0;
  iVar8 = 0;
  do {
    piVar1 = val_count + lVar2;
    iVar5 = (iVar5 - (uint)(*piVar1 == 0)) + 1;
    iVar6 = (iVar6 - (uint)(piVar1[1] == 0)) + 1;
    iVar7 = (iVar7 - (uint)(piVar1[2] == 0)) + 1;
    iVar8 = (iVar8 - (uint)(piVar1[3] == 0)) + 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x100);
  *num_colors = iVar8 + iVar6 + iVar7 + iVar5;
  return;
}

Assistant:

void av1_count_colors(const uint8_t *src, int stride, int rows, int cols,
                      int *val_count, int *num_colors) {
  const int max_pix_val = 1 << 8;
  memset(val_count, 0, max_pix_val * sizeof(val_count[0]));
  for (int r = 0; r < rows; ++r) {
    for (int c = 0; c < cols; ++c) {
      const int this_val = src[r * stride + c];
      assert(this_val < max_pix_val);
      ++val_count[this_val];
    }
  }
  int n = 0;
  for (int i = 0; i < max_pix_val; ++i) {
    if (val_count[i]) ++n;
  }
  *num_colors = n;
}